

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_183fe20::AV1ResolutionChange_InvalidRefSize_Test::TestBody
          (AV1ResolutionChange_InvalidRefSize_Test *this)

{
  undefined8 *puVar1;
  aom_codec_err_t aVar2;
  aom_codec_iface_t *iface;
  aom_codec_cx_pkt_t *lhs;
  aom_image_t *paVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  SEARCH_METHODS *pSVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  AssertionResult gtest_ar_3;
  aom_codec_iter_t iter;
  size_t frame_count;
  RandomVideoSource video;
  aom_codec_ctx_t ctx;
  AssertHelper local_470;
  AssertHelper local_468;
  undefined8 *local_460;
  Message local_458;
  AssertHelper local_450;
  AssertHelper local_448;
  RandomVideoSource local_440;
  AV1ResolutionChange_InvalidRefSize_Test *local_408;
  _func_int **local_400;
  long local_3f8;
  aom_codec_ctx_t local_3f0;
  aom_codec_enc_cfg_t local_3b8;
  
  iface = aom_codec_av1_cx();
  local_408 = this;
  local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource._0_4_ =
       aom_codec_enc_config_default(iface,&local_3b8,(this->super_AV1ResolutionChange).usage_);
  local_468.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_3f0,"aom_codec_enc_config_default(iface, &cfg, usage_)",
             "AOM_CODEC_OK",(aom_codec_err_t *)&local_440,(aom_codec_err_t *)&local_468);
  if ((char)local_3f0.name == '\0') {
    testing::Message::Message((Message *)&local_440);
    if (local_3f0.iface == (aom_codec_iface_t *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = (SEARCH_METHODS *)(local_3f0.iface)->name;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
               ,0x71,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    if (local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource != (_func_int **)0x0) {
      (**(code **)(*local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource + 8))();
    }
    if (local_3f0.iface != (aom_codec_iface_t *)0x0) {
      if ((aom_codec_caps_t *)(local_3f0.iface)->name != &(local_3f0.iface)->caps) {
        operator_delete((local_3f0.iface)->name);
      }
      operator_delete(local_3f0.iface);
    }
  }
  else {
    if (local_3f0.iface != (aom_codec_iface_t *)0x0) {
      if ((aom_codec_caps_t *)(local_3f0.iface)->name != &(local_3f0.iface)->caps) {
        operator_delete((local_3f0.iface)->name);
      }
      operator_delete(local_3f0.iface);
    }
    local_3b8.g_pass = AOM_RC_ONE_PASS;
    local_3b8.g_lag_in_frames = 0;
    local_3b8.rc_end_usage = (local_408->super_AV1ResolutionChange).rc_mode_;
    local_468.data_._0_4_ = aom_codec_enc_init_ver(&local_3f0,iface,&local_3b8,0,0x1d);
    local_450.data_ = (AssertHelperData *)((ulong)local_450.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_440,
               "aom_codec_enc_init_ver(&ctx, iface, &cfg, 0, (10 + (7 + (9)) + 3))","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_468,(aom_codec_err_t *)&local_450);
    if ((char)local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&local_468);
      if (local_440.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x79,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) + 8))
                  ();
      }
    }
    paVar3 = local_440.super_DummyVideoSource.img_;
    if (local_440.super_DummyVideoSource.img_ != (aom_image_t *)0x0) {
      if ((int *)*(undefined1 **)local_440.super_DummyVideoSource.img_ !=
          &(local_440.super_DummyVideoSource.img_)->monochrome) {
        operator_delete(*(undefined1 **)local_440.super_DummyVideoSource.img_);
      }
      operator_delete(paVar3);
    }
    local_468.data_._0_4_ =
         aom_codec_control(&local_3f0,0xd,
                           (ulong)(uint)(local_408->super_AV1ResolutionChange).cpu_used_);
    local_450.data_ = local_450.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_440,"aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_)",
               "AOM_CODEC_OK",(aom_codec_err_t *)&local_468,(aom_codec_err_t *)&local_450);
    if ((char)local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&local_468);
      if (local_440.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x7d,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) + 8))
                  ();
      }
    }
    if (local_440.super_DummyVideoSource.img_ != (aom_image_t *)0x0) {
      if ((int *)*(undefined1 **)local_440.super_DummyVideoSource.img_ !=
          &(local_440.super_DummyVideoSource.img_)->monochrome) {
        operator_delete(*(undefined1 **)local_440.super_DummyVideoSource.img_);
      }
      operator_delete(local_440.super_DummyVideoSource.img_);
    }
    local_450.data_ = (AssertHelperData *)0x0;
    local_400 = (_func_int **)&PTR__DummyVideoSource_01074718;
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__DummyVideoSource_01074718;
    local_440.super_DummyVideoSource.img_ = (aom_image_t *)0x0;
    local_440.super_DummyVideoSource.limit_ = 100;
    local_440.super_DummyVideoSource.width_ = 0x50;
    local_440.super_DummyVideoSource.height_ = 0x40;
    local_440.super_DummyVideoSource.format_ = AOM_IMG_FMT_I420;
    libaom_test::DummyVideoSource::ReallocImage(&local_440.super_DummyVideoSource);
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__DummyVideoSource_01087218;
    local_440.super_DummyVideoSource._44_4_ = 0xbaba;
    local_440.seed_ = 0xbaba;
    local_440.super_DummyVideoSource.frame_ = 0;
    libaom_test::RandomVideoSource::FillFrame(&local_440);
    lVar7 = 0;
    do {
      local_3b8._12_8_ = *(undefined8 *)((long)&TestBody::kFrameSizes._M_elems[0].width + lVar7);
      aVar2 = aom_codec_enc_config_set(&local_3f0,&local_3b8);
      local_458.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = aVar2;
      local_470.data_._0_4_ = AOM_CODEC_OK;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&local_468,"aom_codec_enc_config_set(enc.get(), &cfg)","AOM_CODEC_OK",
                 (aom_codec_err_t *)&local_458,(aom_codec_err_t *)&local_470);
      if (local_468.data_._0_1_ == (internal)0x0) {
        testing::Message::Message(&local_458);
        pSVar5 = "";
        if (local_460 != (undefined8 *)0x0) {
          pSVar5 = (SEARCH_METHODS *)*local_460;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_470,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                   ,0x86,(char *)pSVar5);
        testing::internal::AssertHelper::operator=(&local_470,&local_458);
        testing::internal::AssertHelper::~AssertHelper(&local_470);
        if (local_458.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_458.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
      }
      puVar1 = local_460;
      if (local_460 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_460 != local_460 + 2) {
          operator_delete((undefined8 *)*local_460);
        }
        operator_delete(puVar1);
      }
      local_3f8 = lVar7;
      if ((local_440.super_DummyVideoSource.width_ != local_3b8.g_w) ||
         (local_440.super_DummyVideoSource.height_ != local_3b8.g_h)) {
        local_440.super_DummyVideoSource.width_ = local_3b8.g_w;
        local_440.super_DummyVideoSource.height_ = local_3b8.g_h;
        libaom_test::DummyVideoSource::ReallocImage(&local_440.super_DummyVideoSource);
      }
      iVar6 = 0;
      do {
        local_440.super_DummyVideoSource.frame_ = local_440.super_DummyVideoSource.frame_ + 1;
        (*local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource[10])(&local_440);
        paVar3 = (aom_image_t *)0x0;
        if (local_440.super_DummyVideoSource.frame_ < local_440.super_DummyVideoSource.limit_) {
          paVar3 = local_440.super_DummyVideoSource.img_;
        }
        local_470.data_._0_4_ =
             aom_codec_encode(&local_3f0,paVar3,(ulong)local_440.super_DummyVideoSource.frame_,1,0);
        local_448.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_468,
                   "aom_codec_encode(enc.get(), video.img(), video.pts(), video.duration(), 0)",
                   "AOM_CODEC_OK",(aom_codec_err_t *)&local_470,(aom_codec_err_t *)&local_448);
        if (local_468.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_470);
          pSVar5 = "";
          if (local_460 != (undefined8 *)0x0) {
            pSVar5 = (SEARCH_METHODS *)*local_460;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_448,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                     ,0x90,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_470);
          testing::internal::AssertHelper::~AssertHelper(&local_448);
          if ((long *)CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_) +
                        8))();
          }
        }
        puVar1 = local_460;
        if (local_460 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_460 != local_460 + 2) {
            operator_delete((undefined8 *)*local_460);
          }
          operator_delete(puVar1);
        }
        local_458.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )0x0;
        while( true ) {
          lhs = aom_codec_get_cx_data(&local_3f0,(aom_codec_iter_t *)&local_458);
          if (lhs == (aom_codec_cx_pkt_t *)0x0) break;
          local_470.data_._0_4_ = AOM_CODEC_OK;
          testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
                    ((internal *)&local_468,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",&lhs->kind,
                     (aom_codec_cx_pkt_kind *)&local_470);
          puVar1 = local_460;
          if (local_468.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_470);
            if (local_460 == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = (SEARCH_METHODS *)*local_460;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                       ,0x94,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_470);
            testing::internal::AssertHelper::~AssertHelper(&local_448);
            _Var4._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_);
            goto LAB_00677ba8;
          }
          if (local_460 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_460 != local_460 + 2) {
              operator_delete((undefined8 *)*local_460);
            }
            operator_delete(puVar1);
          }
          if ((iVar6 == 0) || ((local_408->super_AV1ResolutionChange).usage_ == 2)) {
            local_470.data_._0_4_ = (lhs->data).frame.flags & AOM_CODEC_ERROR;
            local_448.data_._0_4_ = 0;
            testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                      ((internal *)&local_468,"pkt->data.frame.flags & 0x1u","0u",(uint *)&local_470
                       ,(uint *)&local_448);
            if (local_468.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_470);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_) + 0x10),
                         "frame ",6);
              std::ostream::_M_insert<unsigned_long>
                        (CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_) + 0x10);
              pSVar5 = "";
              if (local_460 != (undefined8 *)0x0) {
                pSVar5 = (SEARCH_METHODS *)*local_460;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                         ,0x98,(char *)pSVar5);
              testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_470);
              testing::internal::AssertHelper::~AssertHelper(&local_448);
              if ((long *)CONCAT44(local_470.data_._4_4_,(aom_codec_err_t)local_470.data_) !=
                  (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_470.data_._4_4_,
                                               (aom_codec_err_t)local_470.data_) + 8))();
              }
            }
            puVar1 = local_460;
            if (local_460 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_460 != local_460 + 2) {
                operator_delete((undefined8 *)*local_460);
              }
              operator_delete(puVar1);
            }
          }
          local_450.data_ = (AssertHelperData *)((long)&(local_450.data_)->type + 1);
        }
        bVar8 = iVar6 == 0;
        iVar6 = iVar6 + 1;
      } while (bVar8);
      lVar7 = local_3f8 + 8;
    } while (lVar7 != 0x18);
    local_458.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x6;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_468,"frame_count","kNumFramesPerResolution * kFrameSizes.size()",
               (unsigned_long *)&local_450,(unsigned_long *)&local_458);
    if (local_468.data_._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_458);
      if (local_460 == (undefined8 *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = (SEARCH_METHODS *)*local_460;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0xa0,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_470,&local_458);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_458.ss_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
LAB_00677ba8:
      if (_Var4._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)_Var4._M_head_impl + 8))();
      }
    }
    if (local_460 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_460 != local_460 + 2) {
        operator_delete((undefined8 *)*local_460);
      }
      operator_delete(local_460);
    }
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource = local_400;
    aom_img_free(local_440.super_DummyVideoSource.img_);
    aom_codec_destroy(&local_3f0);
  }
  return;
}

Assistant:

TEST_P(AV1ResolutionChange, InvalidRefSize) {
  struct FrameSize {
    unsigned int width;
    unsigned int height;
  };
  static constexpr std::array<FrameSize, 3> kFrameSizes = { {
      { 1768, 200 },
      { 50, 200 },
      { 850, 200 },
  } };

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage_), AOM_CODEC_OK);

  // Resolution changes are only permitted with one pass encoding with no lag.
  cfg.g_pass = AOM_RC_ONE_PASS;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = rc_mode_;

  aom_codec_ctx_t ctx;
  EXPECT_EQ(aom_codec_enc_init(&ctx, iface, &cfg, 0), AOM_CODEC_OK);
  std::unique_ptr<aom_codec_ctx_t, decltype(&aom_codec_destroy)> enc(
      &ctx, &aom_codec_destroy);
  EXPECT_EQ(aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_),
            AOM_CODEC_OK);

  size_t frame_count = 0;
  ::libaom_test::RandomVideoSource video;
  video.Begin();
  constexpr int kNumFramesPerResolution = 2;
  for (const auto &frame_size : kFrameSizes) {
    cfg.g_w = frame_size.width;
    cfg.g_h = frame_size.height;
    EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg), AOM_CODEC_OK);
    video.SetSize(cfg.g_w, cfg.g_h);

    aom_codec_iter_t iter;
    const aom_codec_cx_pkt_t *pkt;

    for (int i = 0; i < kNumFramesPerResolution; ++i) {
      video.Next();  // SetSize() does not call FillFrame().
      EXPECT_EQ(aom_codec_encode(enc.get(), video.img(), video.pts(),
                                 video.duration(), /*flags=*/0),
                AOM_CODEC_OK);

      iter = nullptr;
      while ((pkt = aom_codec_get_cx_data(enc.get(), &iter)) != nullptr) {
        ASSERT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
        // The frame following a resolution change should be a keyframe as the
        // change is too extreme to allow previous references to be used.
        if (i == 0 || usage_ == AOM_USAGE_ALL_INTRA) {
          EXPECT_NE(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u)
              << "frame " << frame_count;
        }
        frame_count++;
      }
    }
  }

  EXPECT_EQ(frame_count, kNumFramesPerResolution * kFrameSizes.size());
}